

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddAsmJsModuleInfo
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  Type value;
  int iVar1;
  PropertyIdArray *pPVar2;
  uint *puVar3;
  BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar4;
  bool bVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint32 uVar9;
  PropertyId PVar10;
  AsmJsModuleInfo *this_00;
  ModuleVar *value_00;
  ModuleVarImport *pMVar11;
  ModuleFunctionImport *pMVar12;
  ModuleFunction *pMVar13;
  ModuleFunctionTable *pMVar14;
  EntryType *pEVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  undefined1 local_88 [8];
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  slotIter;
  int local_5c;
  
  this_00 = (AsmJsModuleInfo *)FunctionProxy::GetAuxPtr((FunctionProxy *)function,AsmJsModuleInfo);
  uVar6 = PrependInt32(this,builder,L"ArgInCount",this_00->mArgInCount,(BufferBuilderInt32 **)0x0);
  uVar7 = PrependInt32(this,builder,L"ExportsCount",this_00->mExportsCount,
                       (BufferBuilderInt32 **)0x0);
  uVar8 = PrependInt32(this,builder,L"SlotsCount",this_00->mSlotsCount,(BufferBuilderInt32 **)0x0);
  local_5c = uVar8 + uVar7 + uVar6;
  if (0 < this_00->mExportsCount) {
    pPVar2 = (this_00->mExports).ptr;
    uVar6 = PrependByte(this,builder,L"ExtraSlotsCount",pPVar2->extraSlots);
    uVar7 = PrependByte(this,builder,L"ExportsIdArrayDups",pPVar2->hadDuplicates);
    uVar8 = PrependByte(this,builder,L"ExportsIdArray__proto__",pPVar2->has__proto__);
    uVar9 = PrependInt32(this,builder,L"ExportsIdArrayLength",pPVar2->count,
                         (BufferBuilderInt32 **)0x0);
    iVar17 = uVar9 + uVar8 + uVar7 + uVar6 + local_5c;
    if (pPVar2->count != 0) {
      uVar16 = 0;
      do {
        PVar10 = encodePossiblyBuiltInPropertyId(this,(&pPVar2[1].count)[uVar16]);
        uVar6 = PrependInt32(this,builder,L"ExportsIdArrayElem",PVar10,(BufferBuilderInt32 **)0x0);
        iVar17 = iVar17 + uVar6;
        uVar16 = uVar16 + 1;
      } while (uVar16 < pPVar2->count);
    }
    iVar1 = this_00->mExportsCount;
    local_5c = 0;
    if (0 < (long)iVar1) {
      puVar3 = (this_00->mExportsFunctionLocation).ptr;
      lVar19 = 0;
      local_5c = 0;
      do {
        uVar6 = PrependConstantInt32
                          (this,builder,L"UInt32 Array Element",puVar3[lVar19],
                           (ConstantSizedBufferBuilderOf<int> **)0x0);
        local_5c = local_5c + uVar6;
        lVar19 = lVar19 + 1;
      } while (iVar1 != lVar19);
    }
    local_5c = local_5c + iVar17;
  }
  iVar17 = 0;
  uVar6 = PrependInt32(this,builder,L"ExportFunctionIndex",this_00->mExportFunctionIndex,
                       (BufferBuilderInt32 **)0x0);
  uVar7 = PrependInt32(this,builder,L"VarCount",this_00->mVarCount,(BufferBuilderInt32 **)0x0);
  local_5c = uVar7 + uVar6 + local_5c;
  if (0 < this_00->mVarCount) {
    do {
      value_00 = AsmJsModuleInfo::GetVar(this_00,iVar17);
      uVar6 = PrependStruct<Js::AsmJsModuleInfo::ModuleVar>(this,builder,L"ModuleVar",value_00);
      local_5c = local_5c + uVar6;
      iVar17 = iVar17 + 1;
    } while (iVar17 < this_00->mVarCount);
  }
  iVar17 = 0;
  uVar6 = PrependInt32(this,builder,L"VarImportCount",this_00->mVarImportCount,
                       (BufferBuilderInt32 **)0x0);
  local_5c = uVar6 + local_5c;
  if (0 < this_00->mVarImportCount) {
    do {
      pMVar11 = AsmJsModuleInfo::GetVarImport(this_00,iVar17);
      value = pMVar11->type;
      PVar10 = pMVar11->field;
      uVar6 = PrependInt32(this,builder,L"ImportLocation",pMVar11->location,
                           (BufferBuilderInt32 **)0x0);
      uVar7 = PrependByte(this,builder,L"ImportType",value);
      PVar10 = encodePossiblyBuiltInPropertyId(this,PVar10);
      uVar8 = PrependInt32(this,builder,L"ImportId",PVar10,(BufferBuilderInt32 **)0x0);
      local_5c = uVar8 + uVar7 + uVar6 + local_5c;
      iVar17 = iVar17 + 1;
    } while (iVar17 < this_00->mVarImportCount);
  }
  iVar17 = 0;
  uVar6 = PrependInt32(this,builder,L"FunctionImportCount",this_00->mFunctionImportCount,
                       (BufferBuilderInt32 **)0x0);
  local_5c = uVar6 + local_5c;
  if (0 < this_00->mFunctionImportCount) {
    do {
      pMVar12 = AsmJsModuleInfo::GetFunctionImport(this_00,iVar17);
      PVar10 = pMVar12->field;
      uVar6 = PrependInt32(this,builder,L"ImportLocation",pMVar12->location,
                           (BufferBuilderInt32 **)0x0);
      PVar10 = encodePossiblyBuiltInPropertyId(this,PVar10);
      uVar7 = PrependInt32(this,builder,L"ImportId",PVar10,(BufferBuilderInt32 **)0x0);
      local_5c = uVar7 + uVar6 + local_5c;
      iVar17 = iVar17 + 1;
    } while (iVar17 < this_00->mFunctionImportCount);
  }
  iVar17 = 0;
  uVar6 = PrependInt32(this,builder,L"FunctionCount",this_00->mFunctionCount,
                       (BufferBuilderInt32 **)0x0);
  local_5c = uVar6 + local_5c;
  if (0 < this_00->mFunctionCount) {
    do {
      pMVar13 = AsmJsModuleInfo::GetFunction(this_00,iVar17);
      uVar6 = PrependInt32(this,builder,L"FuncLocation",pMVar13->location,(BufferBuilderInt32 **)0x0
                          );
      local_5c = local_5c + uVar6;
      iVar17 = iVar17 + 1;
    } while (iVar17 < this_00->mFunctionCount);
  }
  iVar17 = 0;
  uVar6 = PrependInt32(this,builder,L"FunctionTableCount",this_00->mFunctionTableCount,
                       (BufferBuilderInt32 **)0x0);
  local_5c = uVar6 + local_5c;
  if (0 < this_00->mFunctionTableCount) {
    do {
      pMVar14 = AsmJsModuleInfo::GetFunctionTable(this_00,iVar17);
      local_88._0_4_ = pMVar14->size;
      pEVar15 = (EntryType *)(pMVar14->moduleFunctionIndex).ptr;
      Memory::Recycler::WBSetBit((char *)&slotIter);
      slotIter.
      super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
      .entries = pEVar15;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&slotIter);
      uVar6 = PrependInt32(this,builder,L"FuncTableSize",local_88._0_4_,(BufferBuilderInt32 **)0x0);
      pEVar15 = slotIter.
                super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                .entries;
      lVar19 = (long)(int)local_88._0_4_;
      if (0 < lVar19) {
        lVar18 = 0;
        do {
          PrependConstantInt32
                    (this,builder,L"UInt32 Array Element",
                     *(int *)((long)&(pEVar15->
                                     super_DefaultHashedEntry<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                     ).
                                     super_KeyValueEntry<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>
                                     .
                                     super_ValueEntry<Memory::WriteBarrierPtr<Js::AsmJsSlot>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>_>
                                     .
                                     super_KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>
                                     .value.ptr + lVar18 * 4),
                     (ConstantSizedBufferBuilderOf<int> **)0x0);
          lVar18 = lVar18 + 1;
        } while (lVar19 != lVar18);
      }
      local_5c = local_5c + uVar6;
      iVar17 = iVar17 + 1;
    } while (iVar17 < this_00->mFunctionTableCount);
  }
  uVar6 = PrependStruct<Js::AsmJsModuleMemory>(this,builder,L"ModuleMemory",&this_00->mModuleMemory)
  ;
  pBVar4 = (this_00->mSlotMap).ptr;
  uVar7 = PrependInt32(this,builder,L"AsmJsSlotMapCount",pBVar4->count - pBVar4->freeCount,
                       (BufferBuilderInt32 **)0x0);
  iVar17 = uVar7 + uVar6 + local_5c;
  JsUtil::
  BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_88,(this_00->mSlotMap).ptr);
  bVar5 = JsUtil::
          BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                     *)local_88);
  if (bVar5) {
    do {
      pEVar15 = JsUtil::
                BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::
                IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                ::Current((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                           *)local_88);
      PVar10 = encodePossiblyBuiltInPropertyId
                         (this,(pEVar15->
                               super_DefaultHashedEntry<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                               ).super_KeyValueEntry<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>.
                               super_ValueEntry<Memory::WriteBarrierPtr<Js::AsmJsSlot>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>_>
                               .
                               super_KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>
                               .key);
      uVar6 = PrependInt32(this,builder,L"AsmJsSlotPropId",PVar10,(BufferBuilderInt32 **)0x0);
      pEVar15 = JsUtil::
                BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::
                IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                ::Current((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                           *)local_88);
      uVar7 = PrependStruct<Js::AsmJsSlot>
                        (this,builder,L"AsmJsSlotValue",
                         (pEVar15->
                         super_DefaultHashedEntry<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         ).super_KeyValueEntry<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>.
                         super_ValueEntry<Memory::WriteBarrierPtr<Js::AsmJsSlot>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>_>
                         .
                         super_KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>
                         .value.ptr);
      iVar17 = uVar7 + iVar17 + uVar6;
      JsUtil::
      BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                  *)local_88);
      bVar5 = JsUtil::
              BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)local_88);
    } while (bVar5);
  }
  slotIter.
  super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
  ._24_8_ = (this_00->mAsmMathBuiltinUsed).data[0].word;
  uVar6 = PrependStruct<BVStatic<32ul>>
                    (this,builder,L"MathBuiltinBV",
                     (BVStatic<32UL> *)
                     &slotIter.
                      super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                      .usedEntryCount);
  slotIter.
  super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
  ._24_8_ = (this_00->mAsmArrayBuiltinUsed).data[0].word;
  uVar7 = PrependStruct<BVStatic<16ul>>
                    (this,builder,L"ArrayBuiltinBV",
                     (BVStatic<16UL> *)
                     &slotIter.
                      super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                      .usedEntryCount);
  uVar8 = PrependInt32(this,builder,L"MaxHeapAccess",this_00->mMaxHeapAccess,
                       (BufferBuilderInt32 **)0x0);
  return uVar8 + uVar7 + uVar6 + iVar17;
}

Assistant:

uint32 AddAsmJsModuleInfo(BufferBuilderList & builder, FunctionBody * function)
    {
        uint32 size = 0;
        AsmJsModuleInfo * moduleInfo = function->GetAsmJsModuleInfo();

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start Asm.js Module Info"), magicStartOfAsmJsModuleInfo);
#endif

        size += PrependInt32(builder, _u("ArgInCount"), moduleInfo->GetArgInCount());
        size += PrependInt32(builder, _u("ExportsCount"), moduleInfo->GetExportsCount());
        size += PrependInt32(builder, _u("SlotsCount"), moduleInfo->GetSlotsCount());

        if (moduleInfo->GetExportsCount() > 0)
        {
            PropertyIdArray * propArray = moduleInfo->GetExportsIdArray();
            size += PrependByte(builder, _u("ExtraSlotsCount"), propArray->extraSlots);
            size += PrependByte(builder, _u("ExportsIdArrayDups"), propArray->hadDuplicates);
            size += PrependByte(builder, _u("ExportsIdArray__proto__"), propArray->has__proto__);
            size += PrependInt32(builder, _u("ExportsIdArrayLength"), propArray->count);
            for (uint i = 0; i < propArray->count; i++)
            {
                PropertyId propertyId = encodePossiblyBuiltInPropertyId(propArray->elements[i]);
                size += PrependInt32(builder, _u("ExportsIdArrayElem"), propertyId);
            }
            size += PrependUInt32Array(builder, moduleInfo->GetExportsCount(), moduleInfo->GetExportsFunctionLocation());
        }

        size += PrependInt32(builder, _u("ExportFunctionIndex"), moduleInfo->GetExportFunctionIndex());

        size += PrependInt32(builder, _u("VarCount"), moduleInfo->GetVarCount());
        for (int i = 0; i < moduleInfo->GetVarCount(); i++)
        {
            size += PrependStruct(builder, _u("ModuleVar"), &moduleInfo->GetVar(i));
        }

        size += PrependInt32(builder, _u("VarImportCount"), moduleInfo->GetVarImportCount());
        for (int i = 0; i < moduleInfo->GetVarImportCount(); i++)
        {
            auto import = moduleInfo->GetVarImport(i);
            size += PrependInt32(builder, _u("ImportLocation"), import.location);
            size += PrependByte(builder, _u("ImportType"), import.type);
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(import.field);
            size += PrependInt32(builder, _u("ImportId"), propertyId);
        }

        size += PrependInt32(builder, _u("FunctionImportCount"), moduleInfo->GetFunctionImportCount());
        for (int i = 0; i < moduleInfo->GetFunctionImportCount(); i++)
        {
            auto import = moduleInfo->GetFunctionImport(i);
            size += PrependInt32(builder, _u("ImportLocation"), import.location);
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(import.field);
            size += PrependInt32(builder, _u("ImportId"), propertyId);
        }

        size += PrependInt32(builder, _u("FunctionCount"), moduleInfo->GetFunctionCount());
        for (int i = 0; i < moduleInfo->GetFunctionCount(); i++)
        {
            auto func = moduleInfo->GetFunction(i);
            size += PrependInt32(builder, _u("FuncLocation"), func.location);
        }

        size += PrependInt32(builder, _u("FunctionTableCount"), moduleInfo->GetFunctionTableCount());
        for (int i = 0; i < moduleInfo->GetFunctionTableCount(); i++)
        {
            auto table = moduleInfo->GetFunctionTable(i);
            size += PrependInt32(builder, _u("FuncTableSize"), table.size);
            PrependUInt32Array(builder, table.size, table.moduleFunctionIndex);
        }

        size += PrependStruct<AsmJsModuleMemory>(builder, _u("ModuleMemory"), &moduleInfo->GetModuleMemory());

        size += PrependInt32(builder, _u("AsmJsSlotMapCount"), moduleInfo->GetAsmJsSlotMap()->Count());
        auto slotIter = moduleInfo->GetAsmJsSlotMap()->GetIterator();
        while (slotIter.IsValid())
        {
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(slotIter.CurrentKey());
            size += PrependInt32(builder, _u("AsmJsSlotPropId"), propertyId);
            size += PrependStruct(builder, _u("AsmJsSlotValue"), slotIter.CurrentValue());
            slotIter.MoveNext();
        }
        size += PrependStruct(builder, _u("MathBuiltinBV"), &moduleInfo->GetAsmMathBuiltinUsed());
        size += PrependStruct(builder, _u("ArrayBuiltinBV"), &moduleInfo->GetAsmArrayBuiltinUsed());

        size += PrependInt32(builder, _u("MaxHeapAccess"), moduleInfo->GetMaxHeapAccess());

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Asm.js Module Info"), magicEndOfAsmJsModuleInfo);
#endif
        return size;
    }